

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

vector<const_AST_*,_std::allocator<const_AST_*>_> * __thiscall
AST::findAll(vector<const_AST_*,_std::allocator<const_AST_*>_> *__return_storage_ptr__,AST *this,
            RefAST *target)

{
  RefAST local_18;
  
  (__return_storage_ptr__->super__Vector_base<const_AST_*,_std::allocator<const_AST_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<const_AST_*,_std::allocator<const_AST_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<const_AST_*,_std::allocator<const_AST_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18 = (RefAST)target->ref;
  if ((local_18.ref != (Ref *)0x0) && ((local_18.ref)->ptr != (AST *)0x0)) {
    (local_18.ref)->count = (local_18.ref)->count + 1;
    doWorkForFindAll(this,__return_storage_ptr__,&local_18,false);
    RefCount<AST>::~RefCount(&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const AST*> AST::findAll(RefAST target) const
{
	std::vector<const AST*> roots;

	// the empty tree cannot result in an enumeration
	if (target) {
		doWorkForFindAll(roots,target,false); // find all matches recursively
	}

	return roots;
}